

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

Node * __thiscall SQCompilation::SymbolInfo::extractPointedNode(SymbolInfo *this)

{
  SymbolInfo *this_local;
  Id *local_8;
  
  switch(this->kind) {
  case SK_EXCEPTION:
    local_8 = (this->declarator).x;
    break;
  case SK_FUNCTION:
    local_8 = (this->declarator).x;
    break;
  case SK_CLASS:
    local_8 = (this->declarator).x;
    break;
  case SK_TABLE:
    local_8 = (this->declarator).x;
    break;
  case SK_VAR:
  case SK_BINDING:
  case SK_FOREACH:
    local_8 = (this->declarator).x;
    break;
  case SK_CONST:
    local_8 = (this->declarator).x;
    break;
  case SK_ENUM:
    local_8 = (this->declarator).x;
    break;
  case SK_ENUM_CONST:
    local_8 = (Id *)((this->declarator).m)->value;
    break;
  case SK_PARAM:
    local_8 = (this->declarator).x;
    break;
  case SK_EXTERNAL_BINDING:
    local_8 = (this->declarator).x;
    break;
  default:
    local_8 = (Id *)0x0;
  }
  return (Node *)local_8;
}

Assistant:

const Node *extractPointedNode() const {
    switch (kind)
    {
    case SK_EXCEPTION:
      return declarator.x;
    case SK_FUNCTION:
      return declarator.f;
    case SK_CLASS:
      return declarator.k;
    case SK_TABLE:
      return declarator.t;
    case SK_VAR:
    case SK_BINDING:
    case SK_FOREACH:
      return declarator.v;
    case SK_CONST:
      return declarator.c;
    case SK_ENUM:
      return declarator.e;
    case SK_ENUM_CONST:
      return declarator.ec->val;
    case SK_PARAM:
      return declarator.p;
    case SK_EXTERNAL_BINDING:
      return declarator.ev;
    default:
      assert(0);
      return nullptr;
    }
  }